

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namedentity.cpp
# Opt level: O0

string * __thiscall
libcellml::NamedEntity::name_abi_cxx11_(string *__return_storage_ptr__,NamedEntity *this)

{
  NamedEntityImpl *pNVar1;
  NamedEntity *this_local;
  
  pNVar1 = pFunc(this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pNVar1->mName);
  return __return_storage_ptr__;
}

Assistant:

std::string NamedEntity::name() const
{
    return pFunc()->mName;
}